

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int process_alignctl_line(ps_decoder_t *ps,cmd_ln_t *config,char *fname)

{
  int iVar1;
  char *base;
  FILE *__stream;
  size_t __n;
  size_t sVar2;
  char *local_80;
  FILE *fh;
  size_t nread;
  size_t nchars;
  char *text;
  char *alignext;
  char *aligndir;
  char *path;
  int err;
  char *fname_local;
  cmd_ln_t *config_local;
  ps_decoder_t *ps_local;
  
  base = ps_config_str(config,"aligndir");
  local_80 = ps_config_str(config,"alignext");
  nchars = 0;
  if (fname == (char *)0x0) {
    ps_local._4_4_ = 0;
  }
  else {
    if (base == (char *)0x0) {
      if (local_80 == (char *)0x0) {
        aligndir = __ckd_salloc__(fname,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                  ,0x16a);
      }
      else {
        aligndir = string_join(fname,local_80,0);
      }
    }
    else {
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      aligndir = string_join(base,"/",fname,local_80,0);
    }
    __stream = fopen(aligndir,"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                     ,0x16d,"Failed to open transcript file %s",aligndir);
      path._4_4_ = -1;
    }
    else {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      nchars = (size_t)__ckd_calloc__(__n + 1,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                      ,0x173);
      fseek(__stream,0,0);
      sVar2 = fread((void *)nchars,1,__n,__stream);
      if (sVar2 == __n) {
        path._4_4_ = fclose(__stream);
        if (path._4_4_ == 0) {
          iVar1 = ps_set_align_text(ps,(char *)nchars);
          if (iVar1 == 0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                    ,0x182,"Force-aligning with transcript from: %s\n",fname);
          }
          else {
            path._4_4_ = -1;
          }
        }
        else {
          err_msg_system(ERR_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                         ,0x17b,"Failed to close transcript file %s",aligndir);
        }
      }
      else {
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                       ,0x176,"Failed to fully read transcript file %s",aligndir);
        path._4_4_ = -1;
      }
    }
    ckd_free(aligndir);
    ckd_free((void *)nchars);
    ps_local._4_4_ = path._4_4_;
  }
  return ps_local._4_4_;
}

Assistant:

static int
process_alignctl_line(ps_decoder_t *ps, cmd_ln_t *config, char const *fname)
{
    int err;
    char *path = NULL;
    const char *aligndir = ps_config_str(config, "aligndir");
    const char *alignext = ps_config_str(config, "alignext");
    char *text = NULL;
    size_t nchars, nread;
    FILE *fh;

    if (fname == NULL)
        return 0;

    if (aligndir)
        path = string_join(aligndir, "/", fname, alignext ? alignext : "", NULL);
    else if (alignext)
        path = string_join(fname, alignext, NULL);
    else
        path = ckd_salloc(fname);

    if ((fh = fopen(path, "r")) == NULL) {
        E_ERROR_SYSTEM("Failed to open transcript file %s", path);
        err = -1;
        goto error_out;
    }
    fseek(fh, 0, SEEK_END);
    nchars = ftell(fh);
    text = ckd_calloc(nchars + 1, 1);
    fseek(fh, 0, SEEK_SET);
    if ((nread = fread(text, 1, nchars, fh)) != nchars) {
        E_ERROR_SYSTEM("Failed to fully read transcript file %s", path);
        err = -1;
        goto error_out;
    }
    if ((err = fclose(fh)) != 0) {
        E_ERROR_SYSTEM("Failed to close transcript file %s", path);
        goto error_out;
    }
    if (ps_set_align_text(ps, text)) {
        err = -1;
        goto error_out;
    }
    E_INFO("Force-aligning with transcript from: %s\n", fname);

error_out:
    ckd_free(path);
    ckd_free(text);

    return err;
}